

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dieharder_file.cc
# Opt level: O0

void generate<trng::lcg64_shift>(size_t samples,unsigned_long seed)

{
  parameter_type P;
  ostream *poVar1;
  char *pcVar2;
  unsigned_long uVar3;
  result_type rVar4;
  ulong in_RSI;
  ulong in_RDI;
  size_t j;
  lcg64_shift r;
  result_type in_stack_ffffffffffffff98;
  lcg64_shift *in_stack_ffffffffffffffa0;
  ulong local_40;
  
  P.b = (result_type)in_stack_ffffffffffffffa0;
  P.a = in_stack_ffffffffffffff98;
  trng::lcg64_shift::lcg64_shift((lcg64_shift *)0x10687a,P);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "#==================================================================\n");
  poVar1 = std::operator<<(poVar1,"# generator ");
  pcVar2 = trng::lcg64_shift::name();
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,"  seed = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,
                           "#==================================================================\n");
  poVar1 = std::operator<<(poVar1,"type: d\n");
  poVar1 = std::operator<<(poVar1,"count: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RDI);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"numbit: ");
  trng::lcg64_shift::max();
  trng::lcg64_shift::min();
  uVar3 = trng::int_math::log2_ceil<unsigned_long>((unsigned_long)in_stack_ffffffffffffffa0);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar3);
  std::operator<<(poVar1,'\n');
  for (local_40 = 0; local_40 < in_RDI; local_40 = local_40 + 1) {
    in_stack_ffffffffffffffa0 =
         (lcg64_shift *)trng::lcg64_shift::operator()(in_stack_ffffffffffffffa0);
    rVar4 = trng::lcg64_shift::min();
    poVar1 = (ostream *)
             std::ostream::operator<<((ostream *)&std::cout,(long)in_stack_ffffffffffffffa0 - rVar4)
    ;
    std::operator<<(poVar1,'\n');
  }
  return;
}

Assistant:

void generate(std::size_t samples, unsigned long seed) {
  R r;
  std::cout << "#==================================================================\n"
            << "# generator " << r.name() << "  seed = " << seed << "\n"
            << "#==================================================================\n"
            << "type: d\n"
            << "count: " << samples << "\n"
            << "numbit: " << trng::int_math::log2_ceil(r.max() - r.min()) << '\n';
  for (std::size_t j{0}; j < samples; ++j)
    std::cout << r() - r.min() << '\n';
}